

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void DThinker::DestroyAllThinkers(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
    if (local_c != 4) {
      DestroyThinkersInList(Thinkers + local_c);
      DestroyThinkersInList(FreshThinkers + local_c);
    }
  }
  DestroyThinkersInList(Thinkers + 0x80);
  GC::FullGC();
  return;
}

Assistant:

void DThinker::DestroyAllThinkers ()
{
	int i;

	for (i = 0; i <= MAX_STATNUM; i++)
	{
		if (i != STAT_TRAVELLING)
		{
			DestroyThinkersInList (Thinkers[i]);
			DestroyThinkersInList (FreshThinkers[i]);
		}
	}
	DestroyThinkersInList (Thinkers[MAX_STATNUM+1]);
	GC::FullGC();
}